

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O1

void __thiscall
RuntimeInterface::GetInstanceExtensionProperties
          (RuntimeInterface *this,
          vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
          *extension_properties)

{
  pointer *ppXVar1;
  iterator __position;
  pointer pXVar2;
  pointer pXVar3;
  int iVar4;
  long lVar5;
  uint32_t *puVar6;
  ulong __new_size;
  long lVar7;
  uint32_t count_output;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> runtime_extension_properties
  ;
  PFN_xrEnumerateInstanceExtensionProperties rt_xrEnumerateInstanceExtensionProperties;
  XrExtensionProperties example_properties;
  uint local_10c;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> local_108;
  PFN_xrVoidFunction local_f0;
  long local_e8;
  long local_e0;
  pointer local_d8;
  pointer local_d0;
  value_type local_c8;
  
  local_108.super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_get_instance_proc_addr)
            ((XrInstance)0x0,"xrEnumerateInstanceExtensionProperties",&local_f0);
  local_10c = 0;
  (*local_f0)(0,0,&local_10c,0);
  __new_size = (ulong)local_10c;
  if (__new_size != 0) {
    memset(&local_c8,0,0x98);
    local_c8.type = XR_TYPE_EXTENSION_PROPERTIES;
    std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::resize
              (&local_108,__new_size,&local_c8);
    (*local_f0)(0,(ulong)local_10c,&local_10c,
                local_108.
                super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
                _M_impl.super__Vector_impl_data._M_start);
  }
  if ((long)local_108.
            super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_108.
            super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    local_d0 = (extension_properties->
               super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
               _M_impl.super__Vector_impl_data._M_start;
    local_d8 = (extension_properties->
               super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    local_e8 = ((long)local_d8 - (long)local_d0 >> 3) * -0x79435e50d79435e5;
    local_e0 = ((long)local_108.
                      super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_108.
                      super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5;
    local_e8 = local_e8 + (ulong)(local_e8 == 0);
    local_e0 = local_e0 + (ulong)(local_e0 == 0);
    lVar5 = 0;
    do {
      pXVar3 = local_108.
               super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (local_d8 != local_d0) {
        pXVar2 = local_108.
                 super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar5;
        puVar6 = &((extension_properties->
                   super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                   )._M_impl.super__Vector_impl_data._M_start)->extensionVersion;
        lVar7 = local_e8;
        do {
          iVar4 = strcmp((char *)(puVar6 + -0x20),pXVar2->extensionName);
          if (iVar4 == 0) {
            *puVar6 = pXVar3[lVar5].extensionVersion;
            goto LAB_0011b068;
          }
          puVar6 = puVar6 + 0x26;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      __position._M_current =
           (extension_properties->
           super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (extension_properties->
          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<XrExtensionProperties,std::allocator<XrExtensionProperties>>::
        _M_realloc_insert<XrExtensionProperties_const&>
                  ((vector<XrExtensionProperties,std::allocator<XrExtensionProperties>> *)
                   extension_properties,__position,
                   local_108.
                   super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar5);
      }
      else {
        memcpy(__position._M_current,
               local_108.
               super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar5,0x98);
        ppXVar1 = &(extension_properties->
                   super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppXVar1 = *ppXVar1 + 1;
      }
LAB_0011b068:
      lVar5 = lVar5 + 1;
    } while (lVar5 != local_e0);
  }
  if (local_108.super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RuntimeInterface::GetInstanceExtensionProperties(std::vector<XrExtensionProperties>& extension_properties) {
    std::vector<XrExtensionProperties> runtime_extension_properties;
    PFN_xrEnumerateInstanceExtensionProperties rt_xrEnumerateInstanceExtensionProperties;
    _get_instance_proc_addr(XR_NULL_HANDLE, "xrEnumerateInstanceExtensionProperties",
                            reinterpret_cast<PFN_xrVoidFunction*>(&rt_xrEnumerateInstanceExtensionProperties));
    uint32_t count = 0;
    uint32_t count_output = 0;
    // Get the count from the runtime
    rt_xrEnumerateInstanceExtensionProperties(nullptr, count, &count_output, nullptr);
    if (count_output > 0) {
        XrExtensionProperties example_properties{};
        example_properties.type = XR_TYPE_EXTENSION_PROPERTIES;
        runtime_extension_properties.resize(count_output, example_properties);
        count = count_output;
        rt_xrEnumerateInstanceExtensionProperties(nullptr, count, &count_output, runtime_extension_properties.data());
    }
    size_t ext_count = runtime_extension_properties.size();
    size_t props_count = extension_properties.size();
    for (size_t ext = 0; ext < ext_count; ++ext) {
        bool found = false;
        for (size_t prop = 0; prop < props_count; ++prop) {
            // If we find it, then make sure the spec version matches that of the runtime instead of the
            // layer.
            if (strcmp(extension_properties[prop].extensionName, runtime_extension_properties[ext].extensionName) == 0) {
                // Make sure the spec version used is the runtime's
                extension_properties[prop].extensionVersion = runtime_extension_properties[ext].extensionVersion;
                found = true;
                break;
            }
        }
        if (!found) {
            extension_properties.push_back(runtime_extension_properties[ext]);
        }
    }
}